

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O0

int __thiscall
vkt::FunctionPrograms1<vkt::SpirVAssembly::InstanceContext>::init
          (FunctionPrograms1<vkt::SpirVAssembly::InstanceContext> *this,EVP_PKEY_CTX *ctx)

{
  InstanceContext IVar1;
  int extraout_EAX;
  long in_RDX;
  InstanceContext *this_00;
  Function p_Var2;
  undefined1 in_stack_fffffffffffffef0 [200];
  undefined1 auVar3 [32];
  Args *args_local;
  SourceCollections *dst_local;
  FunctionPrograms1<vkt::SpirVAssembly::InstanceContext> *this_local;
  
  p_Var2 = this->m_func;
  this_00 = (InstanceContext *)&stack0xffffffffffffff00;
  SpirVAssembly::InstanceContext::InstanceContext(this_00,(InstanceContext *)(in_RDX + 8));
  IVar1.moduleMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = this_00;
  IVar1.moduleMap._M_t._M_impl._0_8_ = ctx;
  IVar1.moduleMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)p_Var2;
  auVar3 = in_stack_fffffffffffffef0._168_32_;
  IVar1.moduleMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)in_stack_fffffffffffffef0._0_8_;
  IVar1.moduleMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)in_stack_fffffffffffffef0._8_8_;
  IVar1.moduleMap._M_t._M_impl.super__Rb_tree_header._M_node_count =
       in_stack_fffffffffffffef0._16_8_;
  IVar1.inputColors[0].m_value = in_stack_fffffffffffffef0._24_4_;
  IVar1.inputColors[1].m_value = in_stack_fffffffffffffef0._28_4_;
  IVar1.inputColors[2].m_value = in_stack_fffffffffffffef0._32_4_;
  IVar1.inputColors[3].m_value = in_stack_fffffffffffffef0._36_4_;
  IVar1.outputColors[0].m_value = in_stack_fffffffffffffef0._40_4_;
  IVar1.outputColors[1].m_value = in_stack_fffffffffffffef0._44_4_;
  IVar1.outputColors[2].m_value = in_stack_fffffffffffffef0._48_4_;
  IVar1.outputColors[3].m_value = in_stack_fffffffffffffef0._52_4_;
  IVar1.testCodeFragments._M_t._M_impl = (_Rep_type)(_Rep_type)in_stack_fffffffffffffef0._56_48_;
  IVar1.specConstants._M_t._M_impl = (_Rep_type)(_Rep_type)in_stack_fffffffffffffef0._104_48_;
  IVar1.hasTessellation = (bool)in_stack_fffffffffffffef0[0x98];
  IVar1._177_3_ = in_stack_fffffffffffffef0._153_3_;
  IVar1.requiredStages = in_stack_fffffffffffffef0._156_4_;
  IVar1.failResult = in_stack_fffffffffffffef0._160_4_;
  IVar1._188_4_ = in_stack_fffffffffffffef0._164_4_;
  IVar1.failMessageTemplate._M_dataplus = (_Alloc_hider)auVar3[0];
  IVar1.failMessageTemplate._1_7_ = auVar3._1_7_;
  IVar1.failMessageTemplate._M_string_length = auVar3._8_8_;
  IVar1.failMessageTemplate.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
        )auVar3._16_16_;
  (*p_Var2)((SourceCollections *)ctx,IVar1);
  SpirVAssembly::InstanceContext::~InstanceContext((InstanceContext *)&stack0xffffffffffffff00);
  return extraout_EAX;
}

Assistant:

void			init			(vk::SourceCollections& dst, const typename FunctionInstance1<Arg0>::Args& args) const { m_func(dst, args.arg0); }